

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::DrawXFBInstanced::DrawXFBInstanced
          (DrawXFBInstanced *this,Context *context,char *test_name,char *test_description)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,test_name,test_description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawXFBInstanced_021078e0;
  this->m_context = context;
  this->m_program_id_generate = 0;
  this->m_program_id_draw = 0;
  this->m_vao_id = 0;
  this->m_xfb_id = 0;
  this->m_bo_id_xfb = 0;
  this->m_bo_id_uniform = 0;
  this->m_fbo_id = 0;
  this->m_rbo_id = 0;
  return;
}

Assistant:

gl3cts::TransformFeedback::DrawXFBInstanced::DrawXFBInstanced(deqp::Context& context, const char* test_name,
															  const char* test_description)
	: deqp::TestCase(context, test_name, test_description)
	, m_context(context)
	, m_program_id_generate(0)
	, m_program_id_draw(0)
	, m_vao_id(0)
	, m_xfb_id(0)
	, m_bo_id_xfb(0)
	, m_bo_id_uniform(0)
	, m_fbo_id(0)
	, m_rbo_id(0)
{
}